

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall spdlog::pattern_formatter::compile_pattern_(pattern_formatter *this,string *pattern)

{
  pointer puVar1;
  pointer puVar2;
  pattern_formatter *ppVar3;
  pointer __p_1;
  pointer *__ptr_1;
  pointer unaff_RBP;
  pointer *__ptr;
  pointer puVar4;
  _Head_base<0UL,_spdlog::details::flag_formatter_*,_false> this_00;
  pattern_formatter *ppVar5;
  pointer __p;
  const_iterator end;
  padding_info padding;
  padding_info padding_00;
  padding_info pVar6;
  unique_ptr<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
  user_chars;
  pattern_formatter *local_48;
  const_iterator local_40;
  _Head_base<0UL,_spdlog::details::flag_formatter_*,_false> local_38;
  
  end._M_current = (pattern->_M_dataplus)._M_p + pattern->_M_string_length;
  local_48 = (pattern_formatter *)0x0;
  puVar1 = (this->formatters_).
           super__Vector_base<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->formatters_).
           super__Vector_base<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar4 = puVar1;
  this_00._M_head_impl = (flag_formatter *)this;
  if (puVar2 != puVar1) {
    do {
      this_00._M_head_impl =
           (puVar4->_M_t).
           super___uniq_ptr_impl<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
           ._M_t.
           super__Tuple_impl<0UL,_spdlog::details::flag_formatter_*,_std::default_delete<spdlog::details::flag_formatter>_>
           .super__Head_base<0UL,_spdlog::details::flag_formatter_*,_false>._M_head_impl;
      if ((pattern_formatter *)this_00._M_head_impl != (pattern_formatter *)0x0) {
        (*(((pattern_formatter *)this_00._M_head_impl)->super_formatter)._vptr_formatter[1])();
      }
      (puVar4->_M_t).
      super___uniq_ptr_impl<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
      ._M_t.
      super__Tuple_impl<0UL,_spdlog::details::flag_formatter_*,_std::default_delete<spdlog::details::flag_formatter>_>
      .super__Head_base<0UL,_spdlog::details::flag_formatter_*,_false>._M_head_impl =
           (flag_formatter *)0x0;
      unaff_RBP = puVar4 + 1;
      puVar4 = unaff_RBP;
    } while (unaff_RBP != puVar2);
    (this->formatters_).
    super__Vector_base<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar1;
  }
  ppVar5 = (pattern_formatter *)(pattern->_M_dataplus)._M_p;
  ppVar3 = local_48;
  while (local_48 = ppVar3, local_40._M_current = (char *)ppVar5,
        ppVar5 != (pattern_formatter *)end._M_current) {
    if (*(char *)&(ppVar5->super_formatter)._vptr_formatter == '%') {
      if (ppVar3 != (pattern_formatter *)0x0) {
        local_48 = (pattern_formatter *)0x0;
        local_38._M_head_impl = (flag_formatter *)ppVar3;
        std::
        vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
        ::
        emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
                  ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                    *)&this->formatters_,
                   (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                    *)&local_38);
        this_00._M_head_impl = local_38._M_head_impl;
        if ((pattern_formatter *)local_38._M_head_impl != (pattern_formatter *)0x0) {
          (*((formatter *)&(local_38._M_head_impl)->_vptr_flag_formatter)->_vptr_formatter[1])();
        }
      }
      local_40._M_current = (char *)((long)&(ppVar5->super_formatter)._vptr_formatter + 1);
      pVar6 = handle_padspec_((pattern_formatter *)this_00._M_head_impl,&local_40,end);
      if (local_40._M_current == end._M_current) break;
      unaff_RBP = (pointer)((ulong)unaff_RBP & 0xffff000000000000 | pVar6._8_8_ & 0xffffffffffff);
      if ((pVar6._8_8_ >> 0x28 & 1) == 0) {
        padding._8_8_ = unaff_RBP;
        padding.width_ = pVar6.width_;
        this_00._M_head_impl = (flag_formatter *)this;
        handle_flag_<spdlog::details::null_scoped_padder>(this,*local_40._M_current,padding);
      }
      else {
        padding_00._8_8_ = unaff_RBP;
        padding_00.width_ = pVar6.width_;
        this_00._M_head_impl = (flag_formatter *)this;
        handle_flag_<spdlog::details::scoped_padder>(this,*local_40._M_current,padding_00);
      }
    }
    else {
      if (ppVar3 == (pattern_formatter *)0x0) {
        local_48 = (pattern_formatter *)operator_new(0x38);
        (local_48->super_formatter)._vptr_formatter = (_func_int **)0x0;
        (local_48->pattern_)._M_dataplus._M_p = (pointer)0x0;
        (local_48->pattern_)._M_string_length = 0;
        (local_48->pattern_).field_2._M_allocated_capacity = 0;
        *(undefined8 *)((long)&(local_48->pattern_).field_2 + 8) = 0;
        (local_48->eol_)._M_dataplus._M_p = (pointer)0x0;
        (local_48->eol_)._M_string_length = 0;
        (local_48->super_formatter)._vptr_formatter =
             (_func_int **)&PTR__aggregate_formatter_001e73c8;
        (local_48->pattern_).field_2._M_allocated_capacity = (size_type)&local_48->eol_;
        *(undefined8 *)((long)&(local_48->pattern_).field_2 + 8) = 0;
        *(undefined1 *)&(local_48->eol_)._M_dataplus._M_p = 0;
        local_38._M_head_impl = (flag_formatter *)0x0;
      }
      this_00._M_head_impl = (flag_formatter *)&(local_48->pattern_).field_2;
      std::__cxx11::string::push_back((char)this_00._M_head_impl);
    }
    ppVar3 = local_48;
    ppVar5 = (pattern_formatter *)(local_40._M_current + 1);
  }
  ppVar5 = local_48;
  if (local_48 != (pattern_formatter *)0x0) {
    local_48 = (pattern_formatter *)0x0;
    local_40._M_current = (char *)ppVar5;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    if ((pattern_formatter *)local_40._M_current != (pattern_formatter *)0x0) {
      (**(code **)(*(long *)local_40._M_current + 8))();
    }
  }
  if (local_48 != (pattern_formatter *)0x0) {
    std::default_delete<spdlog::details::aggregate_formatter>::operator()
              ((default_delete<spdlog::details::aggregate_formatter> *)&local_48,
               (aggregate_formatter *)local_48);
  }
  return;
}

Assistant:

SPDLOG_INLINE void pattern_formatter::compile_pattern_(const std::string &pattern)
{
    auto end = pattern.end();
    std::unique_ptr<details::aggregate_formatter> user_chars;
    formatters_.clear();
    for (auto it = pattern.begin(); it != end; ++it)
    {
        if (*it == '%')
        {
            if (user_chars) // append user chars found so far
            {
                formatters_.push_back(std::move(user_chars));
            }

            auto padding = handle_padspec_(++it, end);

            if (it != end)
            {
                if (padding.enabled())
                {
                    handle_flag_<details::scoped_padder>(*it, padding);
                }
                else
                {
                    handle_flag_<details::null_scoped_padder>(*it, padding);
                }
            }
            else
            {
                break;
            }
        }
        else // chars not following the % sign should be displayed as is
        {
            if (!user_chars)
            {
                user_chars = details::make_unique<details::aggregate_formatter>();
            }
            user_chars->add_ch(*it);
        }
    }
    if (user_chars) // append raw chars found so far
    {
        formatters_.push_back(std::move(user_chars));
    }
}